

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall soplex::SoPlexBase<double>::Settings::Settings(Settings *this)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x1a; lVar1 = lVar1 + 1) {
    this->_boolParamValues[lVar1] = (bool)(&DAT_00549dd8)[lVar1];
  }
  for (lVar1 = 0; lVar1 != 0x1c; lVar1 = lVar1 + 1) {
    this->_intParamValues[lVar1] = (&DAT_0054a500)[lVar1];
  }
  for (lVar1 = 0; lVar1 != 0x1b; lVar1 = lVar1 + 1) {
    this->_realParamValues[lVar1] = (Real)(&DAT_0054ad18)[lVar1];
  }
  return;
}

Assistant:

SoPlexBase<R>::Settings::Settings()
{
   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
      _boolParamValues[i] = boolParam.defaultValue[i];

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
      _intParamValues[i] = intParam.defaultValue[i];

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
      _realParamValues[i] = realParam.defaultValue[i];

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
      _rationalParamValues[i] = rationalParam.defaultValue[i];

#endif
}